

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  
  pIVar2 = GImGui;
  if (((GImGui->DragDropActive == true) && (GImGui->HoveredWindow != (ImGuiWindow *)0x0)) &&
     (GImGui->CurrentWindow->RootWindow == GImGui->HoveredWindow->RootWindow)) {
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x33ed,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
    }
    bVar3 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if ((bVar3) && ((pIVar2->DragDropPayload).SourceId != id)) {
      IVar1 = bb->Max;
      (pIVar2->DragDropTargetRect).Min = bb->Min;
      (pIVar2->DragDropTargetRect).Max = IVar1;
      pIVar2->DragDropTargetId = id;
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;

    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    return true;
}